

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O0

void __thiscall
CumulativeCalProp::ttef_analyse_tasks
          (CumulativeCalProp *this,int begin,int end,
          list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *tasks,
          int *en_lift,vec<Lit> *expl)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pvVar5;
  int *piVar6;
  IntVar **ppIVar7;
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *in_RCX;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  int *in_R8;
  vec<Lit> *in_R9;
  int dur_lift;
  int max_lift;
  int dur_in_ub;
  int dur_in_lb;
  int sto2;
  int sto1;
  int t;
  int lst0;
  int est0;
  int expl_ub;
  int expl_lb;
  int dur_in;
  int i;
  IntVar *in_stack_fffffffffffffee8;
  CumulativeCalProp *in_stack_fffffffffffffef0;
  IntVar *in_stack_fffffffffffffef8;
  vec<Lit> *in_stack_ffffffffffffff00;
  vec<Lit> *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  long in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  int *in_stack_ffffffffffffff60;
  undefined1 local_54 [60];
  list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *local_18;
  int local_10;
  uint local_c;
  
  local_54._44_8_ = in_R9;
  local_54._52_8_ = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  do {
    bVar2 = std::__cxx11::
            list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>::empty
                      (local_18);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    pvVar5 = std::__cxx11::
             list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>::front
                       ((list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
                         *)in_stack_fffffffffffffef0);
    local_54._40_4_ = pvVar5->task;
    pvVar5 = std::__cxx11::
             list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>::front
                       ((list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>
                         *)in_stack_fffffffffffffef0);
    local_54._36_4_ = pvVar5->dur_in;
    local_54._24_4_ =
         min_start0(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    local_54._20_4_ =
         max_start0(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    iVar3 = *(int *)(in_RDI + 0xc0);
    if (iVar3 == 0) {
LAB_001c90bd:
      local_54._32_4_ = *(int *)(*(long *)(in_RDI + 0x168) + (long)(int)local_54._40_4_ * 4);
      local_54._28_4_ = *(int *)(*(long *)(in_RDI + 0x170) + (long)(int)local_54._40_4_ * 4);
    }
    else {
      iVar4 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      if (iVar3 == 1) {
        if (*(int *)(in_RDI + 0x90) == 1) {
          lVar1 = *(long *)(in_RDI + 0xa0);
          piVar6 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_54._40_4_);
          iVar3 = *(int *)(*(long *)(lVar1 + (long)(*piVar6 + -1) * 8) + (long)(int)local_c * 4);
          lVar1 = *(long *)(in_RDI + 0xa0);
          piVar6 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_54._40_4_);
          local_54._12_4_ =
               iVar3 - *(int *)(*(long *)(lVar1 + (long)(*piVar6 + -1) * 8) +
                               (long)(int)(local_c + local_54._36_4_) * 4);
          local_54._8_4_ =
               min_dur(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
          local_54._8_4_ = local_54._8_4_ - local_54._12_4_;
          local_54._12_4_ = 0;
          for (local_54._16_4_ = local_c;
              (int)local_54._12_4_ < (int)local_54._8_4_ && 0 < (int)local_54._16_4_;
              local_54._16_4_ = local_54._16_4_ + -1) {
            in_stack_ffffffffffffff60 = *(int **)(in_RDI + 0x98);
            piVar6 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_54._40_4_);
            if (*(int *)(*(long *)(in_stack_ffffffffffffff60 + (long)(*piVar6 + -1) * 2) +
                        (long)(local_54._16_4_ + -1) * 4) == 1) {
              local_54._12_4_ = local_54._12_4_ + 1;
            }
          }
          piVar6 = std::min<int>((int *)(*(long *)(in_RDI + 0x168) + (long)(int)local_54._40_4_ * 4)
                                 ,(int *)(local_54 + 0x10));
          local_54._32_4_ = *piVar6;
          local_54._28_4_ = *(int *)(*(long *)(in_RDI + 0x170) + (long)(int)local_54._40_4_ * 4);
        }
        else {
          local_54._12_4_ = 0;
          local_54._8_4_ = min_dur(in_stack_fffffffffffffef0,iVar4);
          local_54._8_4_ = local_54._8_4_ - local_54._36_4_;
          for (local_54._16_4_ = local_c;
              (int)local_54._12_4_ < (int)local_54._8_4_ && 0 < (int)local_54._16_4_;
              local_54._16_4_ = local_54._16_4_ + -1) {
            lVar1 = *(long *)(in_RDI + 0x98);
            piVar6 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_54._40_4_);
            if (*(int *)(*(long *)(lVar1 + (long)(*piVar6 + -1) * 8) +
                        (long)(local_54._16_4_ + -1) * 4) == 1) {
              local_54._12_4_ = local_54._12_4_ + 1;
            }
          }
          piVar6 = std::min<int>((int *)(*(long *)(in_RDI + 0x168) + (long)(int)local_54._40_4_ * 4)
                                 ,(int *)(local_54 + 0x10));
          local_54._32_4_ = *piVar6;
          local_54._12_4_ = 0;
          local_54._8_4_ = local_54._36_4_;
          for (local_54._16_4_ = local_10;
              in_stack_ffffffffffffff4f =
                   (int)local_54._12_4_ < (int)local_54._8_4_ && 0 < (int)local_54._16_4_,
              (int)local_54._12_4_ < (int)local_54._8_4_ && 0 < (int)local_54._16_4_;
              local_54._16_4_ = local_54._16_4_ + -1) {
            in_stack_ffffffffffffff40 = *(long *)(in_RDI + 0x98);
            piVar6 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),local_54._40_4_);
            if (*(int *)(*(long *)(in_stack_ffffffffffffff40 + (long)(*piVar6 + -1) * 8) +
                        (long)(local_54._16_4_ + -1) * 4) == 1) {
              local_54._12_4_ = local_54._12_4_ + 1;
            }
          }
          piVar6 = std::max<int>((int *)(*(long *)(in_RDI + 0x170) + (long)(int)local_54._40_4_ * 4)
                                 ,(int *)(local_54 + 0x10));
          local_54._28_4_ = *piVar6;
        }
      }
      else {
        if (iVar3 != 2) goto LAB_001c90bd;
        local_54._4_4_ = 0;
        local_54._0_4_ = 0;
        iVar3 = *(int *)local_54._52_8_;
        min_usage(in_stack_fffffffffffffef0,iVar4);
        local_54._32_4_ =
             ttef_analyse_tasks_left_shift
                       ((CumulativeCalProp *)
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                        (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                        (int)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,iVar3,
                        (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),in_stack_ffffffffffffff60);
        in_stack_fffffffffffffee8 = (IntVar *)local_54;
        local_54._28_4_ =
             ttef_analyse_tasks_right_shift
                       ((CumulativeCalProp *)
                        CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                        (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                        (int)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,iVar3,
                        (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),in_stack_ffffffffffffff60);
        in_stack_ffffffffffffff3c = local_54._36_4_;
        piVar6 = std::min<int>((int *)(local_54 + 4),(int *)local_54);
        iVar3 = in_stack_ffffffffffffff3c - *piVar6;
        iVar4 = min_usage(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20))
        ;
        *(int *)local_54._52_8_ = *(int *)local_54._52_8_ - iVar4 * iVar3;
      }
    }
    if ((int)local_54._24_4_ < (int)local_54._32_4_) {
      in_stack_ffffffffffffff30 = (vec<Lit> *)local_54._44_8_;
      vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x38),local_54._40_4_);
      getNegGeqLit(in_stack_fffffffffffffee8,0);
      vec<Lit>::push(in_stack_ffffffffffffff00,(Lit *)in_stack_fffffffffffffef8);
    }
    if ((int)local_54._28_4_ < (int)local_54._20_4_) {
      vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x38),local_54._40_4_);
      getNegLeqLit(in_stack_fffffffffffffee8,0);
      vec<Lit>::push(in_stack_ffffffffffffff00,(Lit *)in_stack_fffffffffffffef8);
    }
    iVar3 = min_dur0(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    iVar4 = min_dur(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    if (iVar3 < iVar4) {
      vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x48),local_54._40_4_);
      min_dur(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      getNegGeqLit(in_stack_fffffffffffffee8,0);
      vec<Lit>::push(in_stack_ffffffffffffff00,(Lit *)in_stack_fffffffffffffef8);
    }
    iVar3 = min_usage0(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    iVar4 = min_usage(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    if (iVar3 < iVar4) {
      in_stack_ffffffffffffff00 = (vec<Lit> *)local_54._44_8_;
      ppIVar7 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x58),local_54._40_4_);
      in_stack_fffffffffffffef8 = *ppIVar7;
      min_usage(in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      getNegGeqLit(in_stack_fffffffffffffee8,0);
      vec<Lit>::push(in_stack_ffffffffffffff00,(Lit *)in_stack_fffffffffffffef8);
    }
    std::__cxx11::list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_>::
    pop_front((list<CumulativeCalProp::TaskDur,_std::allocator<CumulativeCalProp::TaskDur>_> *)
              in_stack_fffffffffffffef0);
  } while( true );
}

Assistant:

void CumulativeCalProp::ttef_analyse_tasks(const int begin, const int end,
																					 std::list<TaskDur>& tasks, int& en_lift,
																					 vec<Lit>& expl) {
	while (!tasks.empty()) {
		const int i = tasks.front().task;
		const int dur_in = tasks.front().dur_in;
		int expl_lb;
		int expl_ub;
		const int est0 = min_start0(i);
		const int lst0 = max_start0(i);
		// TTEF_cal: running variable for loops t, storages for execution times sto1 and sto2
		int t;
		int sto1;
		int sto2;
		// Calculate possible lifting
		// TTEF_cal: several changes were necessary
		switch (ttef_expl_deg) {
			case ED_NORMAL:
				// XXX Is min_dur correct
				if (rho == 1) {
					// Resource stays engaged
					sto1 = workingPeriods[taskCalendar[i] - 1][begin] -
								 workingPeriods[taskCalendar[i] - 1][begin + dur_in];
					sto2 = min_dur(i) - sto1;
					sto1 = 0;
					t = begin;
					while (sto1 < sto2 && t > 0) {
						if (calendar[taskCalendar[i] - 1][t - 1] == 1) {
							sto1++;
						}
						t--;
					}
					expl_lb = std::min(est_2[i], t);
					expl_ub = lst_2[i];  // max(lst_2[i], end - dur_in);
				} else {
					// Resource is released
					sto1 = 0;
					sto2 = min_dur(i) - dur_in;
					t = begin;
					while (sto1 < sto2 && t > 0) {
						if (calendar[taskCalendar[i] - 1][t - 1] == 1) {
							sto1++;
						}
						t--;
					}
					expl_lb = std::min(est_2[i], t);
					sto1 = 0;
					sto2 = dur_in;
					t = end;
					while (sto1 < sto2 && t > 0) {
						if (calendar[taskCalendar[i] - 1][t - 1] == 1) {
							sto1++;
						}
						t--;
					}
					expl_ub = std::max(lst_2[i], t);
				}
				// expl_lb = begin + dur_in - min_dur(i); expl_ub = end - dur_in;
				break;
			//-----------------------------------------------------------
			case ED_LIFT: {
				int dur_in_lb = 0;
				int dur_in_ub = 0;
				// Computing maximal lift for the work days inside the time window [begin, end)
				const int max_lift = en_lift / min_usage(i);
				// Computing the lifted lower and upper bound on the start time
				expl_lb = ttef_analyse_tasks_left_shift(begin, end, dur_in, i, max_lift, dur_in_lb);
				expl_ub = ttef_analyse_tasks_right_shift(begin, end, dur_in, i, max_lift, dur_in_ub);
				// Some consistency checks
				assert(dur_in - dur_in_lb <= max_lift);
				assert(dur_in - dur_in_ub <= max_lift);
				assert(ttef_analyse_tasks_check_expl_lb(begin, end, i, std::min(dur_in_lb, dur_in_ub),
																								expl_lb));
				assert(ttef_analyse_tasks_check_expl_ub(begin, end, i, std::min(dur_in_lb, dur_in_ub),
																								expl_ub));
				// Computing the used lift
				const int dur_lift = dur_in - std::min(dur_in_lb, dur_in_ub);
				// Updating the remaining energy for lifting
				en_lift -= min_usage(i) * dur_lift;
			} break;
			//-----------------------------------------------------------
			case ED_NAIVE:
			default:
				expl_lb = est_2[i];
				expl_ub = lst_2[i];
		}
		// printf("%d: dur_in %d/%d; en_in %d; est0 %d; lst0 %d\t", i, dur_in, dur[i], dur_in *
		// min_usage(i), est0, lst0);
		if (est0 < expl_lb) {
			// printf("s[%d] >= %d; ", i, expl_lb);
			expl.push(getNegGeqLit(start[i], expl_lb));
		}
		if (expl_ub < lst0) {
			// printf("s[%d] <= %d; ", i, expl_ub);
			expl.push(getNegLeqLit(start[i], expl_ub));
		}
		// Get the negated literal for [[dur[i] >= min_dur(i)]]
		if (min_dur0(i) < min_dur(i)) {
			expl.push(getNegGeqLit(dur[i], min_dur(i)));
		}
		// Get the negated literal for [[usage[i] >= min_usage(i)]]
		if (min_usage0(i) < min_usage(i)) {
			expl.push(getNegGeqLit(usage[i], min_usage(i)));
		}
		// printf("\n");
		tasks.pop_front();
	}
}